

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpy_s.c
# Opt level: O0

errno_t strcpy_s(char *s1,rsize_t s1max,char *s2)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *local_38;
  char *src;
  char *dest;
  char *s2_local;
  rsize_t s1max_local;
  char *s1_local;
  
  s2_local = (char *)s1max;
  if ((((s1 == (char *)0x0) || (s2_local = (char *)s1max, s2 == (char *)0x0)) ||
      (s2_local = (char *)s1max, 0x7fffffffffffffff < s1max)) ||
     (local_38 = s2, src = s1, s2_local = (char *)s1max, s1max == 0)) {
LAB_0010bf73:
    if (((s1 != (char *)0x0) && (s2_local != (char *)0x0)) &&
       (s2_local < (char *)0x8000000000000000)) {
      *s1 = '\0';
    }
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    s1_local._4_4_ = 0x16;
  }
  else {
    do {
      pcVar2 = s2_local + -1;
      bVar3 = s2_local == (char *)0x0;
      s2_local = pcVar2;
      if (((bVar3) || (src == s2)) || (local_38 == s1)) goto LAB_0010bf73;
      cVar1 = *local_38;
      *src = cVar1;
      local_38 = local_38 + 1;
      src = src + 1;
    } while (cVar1 != '\0');
    s1_local._4_4_ = 0;
  }
  return s1_local._4_4_;
}

Assistant:

errno_t strcpy_s( char * _PDCLIB_restrict s1, rsize_t s1max, const char * _PDCLIB_restrict s2 )
{
    char * dest = s1;
    const char * src = s2;

    if ( s1 != NULL && s2 != NULL && s1max <= RSIZE_MAX && s1max != 0 )
    {
        while ( s1max-- )
        {
            if ( dest == s2 || src == s1 )
            {
                goto runtime_constraint_violation;
            }

            if ( ( *dest++ = *src++ ) == '\0' )
            {
                return 0;
            }
        }
    }

runtime_constraint_violation:

    if ( s1 != NULL && s1max > 0 && s1max <= RSIZE_MAX )
    {
        s1[0] = '\0';
    }

    _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
    return _PDCLIB_EINVAL;
}